

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O1

int __thiscall TCPConnection::Read(TCPConnection *this)

{
  byte bVar1;
  ushort uVar2;
  uint16_t uVar3;
  
  if (this->RxBufferEmpty == true) {
    do {
      if (this->LastAck != this->AcknowledgementNumber) {
        SendFlags(this,'\x10');
      }
      osEvent::Wait(&this->Event,
                    "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/tcp_stack/TCPConnection.cpp"
                    ,0x109,-1);
    } while (this->RxBufferEmpty != false);
  }
  uVar2 = this->RxOutOffset;
  this->RxOutOffset = uVar2 + 1;
  bVar1 = this->RxBuffer[uVar2];
  uVar3 = 0;
  if ((ushort)(uVar2 + 1) < 0x100) {
    uVar3 = uVar2 + 1;
  }
  this->RxOutOffset = uVar3;
  this->AcknowledgementNumber = this->AcknowledgementNumber + 1;
  this->CurrentWindow = this->CurrentWindow + 1;
  if (uVar3 == this->RxInOffset) {
    this->RxBufferEmpty = true;
  }
  return (int)bVar1;
}

Assistant:

int TCPConnection::Read()
{
    int rc = -1;

    while (RxBufferEmpty)
    {
        if (LastAck != AcknowledgementNumber)
        {
            SendFlags(FLAG_ACK);
        }
        Event.Wait(__FILE__, __LINE__);
    }

    rc = RxBuffer[RxOutOffset++];
    if (RxOutOffset >= TCP_RX_WINDOW_SIZE)
    {
        RxOutOffset = 0;
    }
    AcknowledgementNumber++;
    CurrentWindow++;

    if (RxOutOffset == RxInOffset)
    {
        RxBufferEmpty = true;
    }

    // if( CurrentWindow == TCP_RX_WINDOW_SIZE && LastAck != AcknowledgementNumber )
    //{
    //   // The Rx buffer is empty, might as well ack
    //   Send( FLAG_ACK );
    //}

    return rc;
}